

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O0

ostream * __thiscall pstack::Flags::dump(Flags *this,ostream *os)

{
  bool bVar1;
  reference poVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  mapped_type *datum;
  option *opt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<option,_std::allocator<option>_> *__range1;
  ostream *os_local;
  Flags *this_local;
  
  __end1 = std::vector<option,_std::allocator<option>_>::begin
                     ((vector<option,_std::allocator<option>_> *)this);
  opt = (option *)
        std::vector<option,_std::allocator<option>_>::end
                  ((vector<option,_std::allocator<option>_> *)this);
  while (bVar1 = __gnu_cxx::
                 operator==<const_option_*,_std::vector<option,_std::allocator<option>_>_>
                           (&__end1,(__normal_iterator<const_option_*,_std::vector<option,_std::allocator<option>_>_>
                                     *)&opt), ((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = __gnu_cxx::
             __normal_iterator<const_option_*,_std::vector<option,_std::allocator<option>_>_>::
             operator*(&__end1);
    if (poVar2->name != (char *)0x0) {
      pmVar3 = std::
               map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
               ::at((map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                     *)(this + 0x18),&poVar2->val);
      std::operator<<(os,"    [");
      if (0 < poVar2->val) {
        poVar4 = std::operator<<(os,"-");
        poVar4 = std::operator<<(poVar4,(char)poVar2->val);
        std::operator<<(poVar4,"|");
      }
      poVar4 = std::operator<<(os,"--");
      std::operator<<(poVar4,poVar2->name);
      if (poVar2->has_arg != 0) {
        poVar4 = std::operator<<(os," <");
        poVar4 = std::operator<<(poVar4,pmVar3->metavar);
        std::operator<<(poVar4,">");
      }
      poVar4 = std::operator<<(os,"]\n        ");
      poVar4 = std::operator<<(poVar4,pmVar3->helptext);
      std::operator<<(poVar4,"\n");
    }
    __gnu_cxx::__normal_iterator<const_option_*,_std::vector<option,_std::allocator<option>_>_>::
    operator++(&__end1);
  }
  return os;
}

Assistant:

std::ostream &
Flags::dump(std::ostream &os) const
{
    for (const auto &opt  : longOptions) {
        if (opt.name == nullptr)
            continue;
        const auto &datum = data.at(opt.val);
        os << "    [";
        if (opt.val > 0)
           os << "-" << char(opt.val) << "|";
        os << "--" << opt.name;
        if (opt.has_arg != 0)
            os << " <" << datum.metavar << ">";
        os << "]\n        " << datum.helptext << "\n";
    }
    return os;
}